

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ilvev_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  
  lVar1 = (ulong)wd * 0x10;
  *(undefined4 *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       *(undefined4 *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  *(undefined4 *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       *(undefined4 *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  *(float32 *)((long)(env->active_fpu).fpr + lVar1 + 4) = (env->active_fpu).fpr[ws].fs[0];
  (env->active_fpu).fpr[wd].fs[0] = (env->active_fpu).fpr[wt].fs[0];
  return;
}

Assistant:

void helper_msa_ilvev_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

#if defined(HOST_WORDS_BIGENDIAN)
    pwd->w[2] = pws->w[3];
    pwd->w[3] = pwt->w[3];
    pwd->w[0] = pws->w[1];
    pwd->w[1] = pwt->w[1];
#else
    pwd->w[3] = pws->w[2];
    pwd->w[2] = pwt->w[2];
    pwd->w[1] = pws->w[0];
    pwd->w[0] = pwt->w[0];
#endif
}